

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * google::protobuf::strings::Utf8SafeCEscape(string *__return_storage_ptr__,string *src)

{
  int iVar1;
  char *pcVar2;
  char *dest_00;
  LogMessage *other;
  ulong uVar3;
  allocator local_7b;
  LogFinisher local_7a;
  byte local_79;
  LogMessage local_78;
  int local_2c;
  int len;
  scoped_array<char> dest;
  int dest_length;
  string *src_local;
  
  iVar1 = std::__cxx11::string::size();
  dest.array_._4_4_ = iVar1 * 4 + 1;
  pcVar2 = (char *)operator_new__((long)dest.array_._4_4_);
  protobuf::internal::scoped_array<char>::scoped_array
            ((scoped_array<char> *)&stack0xffffffffffffffd8,pcVar2);
  pcVar2 = (char *)std::__cxx11::string::data();
  iVar1 = std::__cxx11::string::size();
  dest_00 = protobuf::internal::scoped_array<char>::get
                      ((scoped_array<char> *)&stack0xffffffffffffffd8);
  local_2c = CEscapeInternal(pcVar2,iVar1,dest_00,dest.array_._4_4_,false,true);
  local_79 = 0;
  if (local_2c < 0) {
    protobuf::internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x272);
    local_79 = 1;
    other = protobuf::internal::LogMessage::operator<<(&local_78,"CHECK failed: (len) >= (0): ");
    protobuf::internal::LogFinisher::operator=(&local_7a,other);
  }
  if ((local_79 & 1) != 0) {
    protobuf::internal::LogMessage::~LogMessage(&local_78);
  }
  pcVar2 = protobuf::internal::scoped_array<char>::get
                     ((scoped_array<char> *)&stack0xffffffffffffffd8);
  uVar3 = (ulong)local_2c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,uVar3,&local_7b);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b);
  protobuf::internal::scoped_array<char>::~scoped_array
            ((scoped_array<char> *)&stack0xffffffffffffffd8);
  return __return_storage_ptr__;
}

Assistant:

string Utf8SafeCEscape(const string& src) {
  const int dest_length = src.size() * 4 + 1; // Maximum possible expansion
  scoped_array<char> dest(new char[dest_length]);
  const int len = CEscapeInternal(src.data(), src.size(),
                                  dest.get(), dest_length, false, true);
  GOOGLE_DCHECK_GE(len, 0);
  return string(dest.get(), len);
}